

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O3

void __thiscall ThreadedReplayer::free_pipelines(ThreadedReplayer *this)

{
  _Hash_node_base *p_Var1;
  size_type sVar2;
  
  for (p_Var1 = (this->compute_pipelines)._M_h._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    if ((VkPipeline)p_Var1[2]._M_nxt != (VkPipeline)0x0) {
      (*vkDestroyPipeline)
                (((this->device)._M_t.
                  super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                  .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->device,
                 (VkPipeline)p_Var1[2]._M_nxt,(VkAllocationCallbacks *)0x0);
    }
  }
  for (p_Var1 = (this->graphics_pipelines)._M_h._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    if ((VkPipeline)p_Var1[2]._M_nxt != (VkPipeline)0x0) {
      (*vkDestroyPipeline)
                (((this->device)._M_t.
                  super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                  .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->device,
                 (VkPipeline)p_Var1[2]._M_nxt,(VkAllocationCallbacks *)0x0);
    }
  }
  for (p_Var1 = (this->raytracing_pipelines)._M_h._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    if ((VkPipeline)p_Var1[2]._M_nxt != (VkPipeline)0x0) {
      (*vkDestroyPipeline)
                (((this->device)._M_t.
                  super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                  .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->device,
                 (VkPipeline)p_Var1[2]._M_nxt,(VkAllocationCallbacks *)0x0);
    }
  }
  sVar2 = (this->graphics_pipelines)._M_h._M_element_count;
  this->compute_pipelines_cleared =
       this->compute_pipelines_cleared + (this->compute_pipelines)._M_h._M_element_count;
  this->graphics_pipelines_cleared = this->graphics_pipelines_cleared + sVar2;
  this->raytracing_pipelines_cleared =
       this->raytracing_pipelines_cleared + (this->raytracing_pipelines)._M_h._M_element_count;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->compute_pipelines)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->graphics_pipelines)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->raytracing_pipelines)._M_h);
  return;
}

Assistant:

void free_pipelines()
	{
		for (auto &pipeline : compute_pipelines)
			if (pipeline.second)
				vkDestroyPipeline(device->get_device(), pipeline.second, nullptr);
		for (auto &pipeline : graphics_pipelines)
			if (pipeline.second)
				vkDestroyPipeline(device->get_device(), pipeline.second, nullptr);
		for (auto &pipeline : raytracing_pipelines)
			if (pipeline.second)
				vkDestroyPipeline(device->get_device(), pipeline.second, nullptr);

		// Keep track of how many entries we would have had for accurate reporting.
		compute_pipelines_cleared += compute_pipelines.size();
		graphics_pipelines_cleared += graphics_pipelines.size();
		raytracing_pipelines_cleared += raytracing_pipelines.size();

		compute_pipelines.clear();
		graphics_pipelines.clear();
		raytracing_pipelines.clear();
	}